

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall soul::AST::StaticAssertion::~StaticAssertion(StaticAssertion *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__StaticAssertion_002d6300;
  pcVar2 = (this->errorMessage)._M_dataplus._M_p;
  paVar1 = &(this->errorMessage).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ASTObject::~ASTObject((ASTObject *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

StaticAssertion (const Context& c, Expression& failureCondition, std::string error)
            : Expression (ObjectType::StaticAssertion, c, ExpressionKind::unknown),
              condition (failureCondition), errorMessage (std::move (error))
        {
            if (errorMessage.empty())
                errorMessage = "static_assert failed";

            SOUL_ASSERT (isPossiblyValue (condition.get()));
        }